

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O3

void __thiscall Rml::DecoratorText::~DecoratorText(DecoratorText *this)

{
  ~DecoratorText(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

DecoratorText::~DecoratorText() {}